

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

Maybe<kj::Array<unsigned_long>_> *
kj::parse::
Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'['>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::ExactlyConst_<char,_'x'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,_']'>_>,_false>
::Impl<kj::parse::IteratorInput<char,_const_char_*>,_unsigned_long>::apply
          (Maybe<kj::Array<unsigned_long>_> *__return_storage_ptr__,
          Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>
          *subParser,IteratorInput<char,_const_char_*> *input)

{
  char cVar1;
  Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>
  *pSVar2;
  char *pcVar3;
  size_t newSize;
  Results results;
  IteratorInput<char,_const_char_*> subInput;
  Vector<unsigned_long> local_88;
  IteratorInput<char,_const_char_*> *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  Maybe<kj::Array<unsigned_long>_> *local_48;
  char local_40;
  Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>
  *local_38;
  
  local_88.builder.ptr = (unsigned_long *)0x0;
  local_88.builder.pos = (unsigned_long *)0x0;
  local_88.builder.endPtr = (unsigned_long *)0x0;
  local_88.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_48 = __return_storage_ptr__;
  do {
    pcVar3 = input->pos;
    if (pcVar3 == input->end) break;
    local_68 = input;
    local_60 = pcVar3;
    local_58 = input->end;
    local_50 = pcVar3;
    Sequence_<kj::parse::ExactlyConst_<char,_'['>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::ExactlyConst_<char,_'x'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,_']'>_>
    ::parseNext<kj::parse::IteratorInput<char,_const_char_*>_>
              ((Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>
                *)&local_40,(IteratorInput<char,_const_char_*> *)subParser);
    pSVar2 = local_38;
    cVar1 = local_40;
    if (local_40 == '\x01') {
      local_68->pos = local_60;
      if (local_88.builder.pos == local_88.builder.endPtr) {
        newSize = (long)local_88.builder.endPtr - (long)local_88.builder.ptr >> 2;
        if (local_88.builder.endPtr == local_88.builder.ptr) {
          newSize = 4;
        }
        Vector<unsigned_long>::setCapacity(&local_88,newSize);
      }
      *local_88.builder.pos = (RemoveConst<unsigned_long>)pSVar2;
      local_88.builder.pos = local_88.builder.pos + 1;
    }
    if (local_68 != (IteratorInput<char,_const_char_*> *)0x0) {
      pcVar3 = local_50;
      if (local_50 < local_60) {
        pcVar3 = local_60;
      }
      if (pcVar3 <= local_68->best) {
        pcVar3 = local_68->best;
      }
      local_68->best = pcVar3;
    }
  } while (cVar1 != '\0');
  if (local_88.builder.pos != local_88.builder.endPtr) {
    Vector<unsigned_long>::setCapacity
              (&local_88,(long)local_88.builder.pos - (long)local_88.builder.ptr >> 3);
  }
  (local_48->ptr).isSet = true;
  (local_48->ptr).field_1.value.ptr = local_88.builder.ptr;
  (local_48->ptr).field_1.value.size_ = (long)local_88.builder.pos - (long)local_88.builder.ptr >> 3
  ;
  (local_48->ptr).field_1.value.disposer = local_88.builder.disposer;
  return local_48;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_SOME(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(subResult));
      } else {
        break;
      }
    }